

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::CopyBLAS(DeviceContextVkImpl *this,CopyBLASAttribs *Attribs)

{
  undefined8 this_00;
  Uint32 Count;
  BottomLevelASVkImpl *this_01;
  char *OpName;
  VkCopyAccelerationStructureInfoKHR Info;
  BottomLevelASVkImpl *pDstVk;
  BottomLevelASVkImpl *pSrcVk;
  CopyBLASAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::CopyBLAS
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  this_01 = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>(Attribs->pSrc);
  Info._32_8_ = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>(Attribs->pDst);
  BottomLevelASBase<Diligent::EngineVkImplTraits>::CopyGeometryDescription
            ((BottomLevelASBase<Diligent::EngineVkImplTraits> *)Info._32_8_,
             &this_01->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
  this_00 = Info._32_8_;
  Count = BottomLevelASBase<Diligent::EngineVkImplTraits>::GetActualGeometryCount
                    (&this_01->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
  BottomLevelASBase<Diligent::EngineVkImplTraits>::SetActualGeometryCount
            ((BottomLevelASBase<Diligent::EngineVkImplTraits> *)this_00,Count);
  memset(&OpName,0,0x28);
  OpName._0_4_ = 0x3b9d13fa;
  Info.pNext = BottomLevelASVkImpl::GetVkBLAS(this_01);
  Info.src = BottomLevelASVkImpl::GetVkBLAS((BottomLevelASVkImpl *)Info._32_8_);
  Info.dst._0_4_ = CopyASModeToVkCopyAccelerationStructureMode(Attribs->Mode);
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBLASState
            (this,this_01,Attribs->SrcTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
             "Copy BottomLevelAS (DeviceContextVkImpl::CopyBLAS)");
  TransitionOrVerifyBLASState
            (this,(BottomLevelASVkImpl *)Info._32_8_,Attribs->DstTransitionMode,
             RESOURCE_STATE_BUILD_AS_WRITE,"Copy BottomLevelAS (DeviceContextVkImpl::CopyBLAS)");
  VulkanUtilities::VulkanCommandBuffer::CopyAccelerationStructure
            (&this->m_CommandBuffer,(VkCopyAccelerationStructureInfoKHR *)&OpName);
  (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  BottomLevelASBase<Diligent::EngineVkImplTraits>::DvpUpdateVersion
            ((BottomLevelASBase<Diligent::EngineVkImplTraits> *)Info._32_8_);
  return;
}

Assistant:

void DeviceContextVkImpl::CopyBLAS(const CopyBLASAttribs& Attribs)
{
    TDeviceContextBase::CopyBLAS(Attribs, 0);

    BottomLevelASVkImpl* pSrcVk = ClassPtrCast<BottomLevelASVkImpl>(Attribs.pSrc);
    BottomLevelASVkImpl* pDstVk = ClassPtrCast<BottomLevelASVkImpl>(Attribs.pDst);

    // Dst BLAS description has specified CompactedSize, but doesn't have specified pTriangles and pBoxes.
    // We should copy geometries because it required for SBT to map geometry name to hit group.
    pDstVk->CopyGeometryDescription(*pSrcVk);
    pDstVk->SetActualGeometryCount(pSrcVk->GetActualGeometryCount());

    VkCopyAccelerationStructureInfoKHR Info = {};

    Info.sType = VK_STRUCTURE_TYPE_COPY_ACCELERATION_STRUCTURE_INFO_KHR;
    Info.src   = pSrcVk->GetVkBLAS();
    Info.dst   = pDstVk->GetVkBLAS();
    Info.mode  = CopyASModeToVkCopyAccelerationStructureMode(Attribs.Mode);

    EnsureVkCmdBuffer();

    const char* OpName = "Copy BottomLevelAS (DeviceContextVkImpl::CopyBLAS)";
    TransitionOrVerifyBLASState(*pSrcVk, Attribs.SrcTransitionMode, RESOURCE_STATE_BUILD_AS_READ, OpName);
    TransitionOrVerifyBLASState(*pDstVk, Attribs.DstTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, OpName);

    m_CommandBuffer.CopyAccelerationStructure(Info);
    ++m_State.NumCommands;

#ifdef DILIGENT_DEVELOPMENT
    pDstVk->DvpUpdateVersion();
#endif
}